

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  undefined2 *puVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  BIT_DStream_t local_68;
  
  if ((flags & 1U) != 0) {
    sVar5 = HUF_decompress1X2_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar5;
  }
  sVar5 = BIT_initDStream(&local_68,cSrc,cSrcSize);
  if (0xffffffffffffff88 < sVar5) {
    return sVar5;
  }
  puVar1 = (undefined2 *)((long)dst + dstSize);
  iVar12 = (int)local_68.start;
  cVar2 = (char)(*DTable >> 0x10);
  if (dstSize < 8) {
    uVar10 = (ulong)local_68.bitsConsumed;
    if (uVar10 < 0x41) {
      if (local_68.ptr < local_68.limitPtr) {
        if (local_68.ptr == local_68.start) goto LAB_0019f57f;
        uVar10 = (ulong)(uint)((int)local_68.ptr - iVar12);
        if (local_68.start <= (size_t *)((long)local_68.ptr - (ulong)(local_68.bitsConsumed >> 3)))
        {
          uVar10 = (ulong)(local_68.bitsConsumed >> 3);
        }
        local_68.bitsConsumed = local_68.bitsConsumed + (int)uVar10 * -8;
      }
      else {
        uVar10 = (ulong)(local_68.bitsConsumed >> 3);
        local_68.bitsConsumed = local_68.bitsConsumed & 7;
      }
      local_68.ptr = (char *)((long)local_68.ptr - uVar10);
      uVar10 = (ulong)local_68.bitsConsumed;
      local_68.bitContainer = *(size_t *)local_68.ptr;
    }
  }
  else {
    bVar6 = -cVar2 & 0x3f;
    uVar10 = (ulong)local_68.bitsConsumed;
    if ((*DTable & 0xfc0000) < 0xc0000) {
      while (uVar7 = (uint)uVar10, uVar7 < 0x41) {
        if (local_68.ptr < local_68.limitPtr) {
          if (local_68.ptr == local_68.start) break;
          bVar14 = local_68.start <= (size_t *)((long)local_68.ptr - (uVar10 >> 3));
          uVar8 = (int)local_68.ptr - iVar12;
          if (bVar14) {
            uVar8 = (uint)(uVar10 >> 3);
          }
          uVar7 = uVar7 + uVar8 * -8;
        }
        else {
          uVar8 = (uint)(uVar10 >> 3);
          uVar7 = uVar7 & 7;
          bVar14 = true;
        }
        uVar10 = (ulong)uVar7;
        local_68.ptr = (char *)((long)local_68.ptr - (ulong)uVar8);
        local_68.bitContainer = *(size_t *)local_68.ptr;
        if (((undefined2 *)((long)puVar1 - 9U) <= dst) || (!bVar14)) break;
        uVar10 = (local_68.bitContainer << ((byte)uVar7 & 0x3f)) >> bVar6;
        *(short *)dst = (short)DTable[uVar10 + 1];
        iVar9 = *(byte *)((long)DTable + uVar10 * 4 + 6) + uVar7;
        uVar10 = (ulong)*(byte *)((long)DTable + uVar10 * 4 + 7);
        uVar11 = (local_68.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
        *(short *)((long)dst + uVar10) = (short)DTable[uVar11 + 1];
        iVar9 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar9;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        lVar3 = uVar11 + uVar10;
        uVar13 = (local_68.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
        *(short *)((long)dst + uVar11 + uVar10) = (short)DTable[uVar13 + 1];
        iVar9 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar9;
        uVar10 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        lVar4 = uVar10 + lVar3;
        uVar13 = (local_68.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
        *(short *)((long)dst + uVar10 + lVar3) = (short)DTable[uVar13 + 1];
        iVar9 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar9;
        uVar11 = (local_68.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
        uVar10 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        *(short *)((long)dst + uVar10 + lVar4) = (short)DTable[uVar11 + 1];
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7) + uVar10 + lVar4)
        ;
        uVar10 = (ulong)((uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar9);
      }
    }
    else {
      for (; uVar7 = (uint)uVar10, uVar7 < 0x41;
          uVar10 = (ulong)((uint)*(byte *)((long)DTable + uVar10 * 4 + 6) + iVar9)) {
        if (local_68.ptr < local_68.limitPtr) {
          if (local_68.ptr == local_68.start) break;
          bVar14 = local_68.start <= (size_t *)((long)local_68.ptr - (uVar10 >> 3));
          uVar11 = (ulong)(uint)((int)local_68.ptr - iVar12);
          if (bVar14) {
            uVar11 = uVar10 >> 3;
          }
          uVar7 = uVar7 + (int)uVar11 * -8;
        }
        else {
          uVar11 = uVar10 >> 3;
          uVar7 = uVar7 & 7;
          bVar14 = true;
        }
        uVar10 = (ulong)uVar7;
        local_68.ptr = (char *)((long)local_68.ptr - uVar11);
        local_68.bitContainer = *(size_t *)local_68.ptr;
        if (((undefined2 *)((long)puVar1 - 7U) <= dst) || (!bVar14)) break;
        uVar10 = (local_68.bitContainer << ((byte)uVar7 & 0x3f)) >> bVar6;
        *(short *)dst = (short)DTable[uVar10 + 1];
        iVar9 = *(byte *)((long)DTable + uVar10 * 4 + 6) + uVar7;
        uVar10 = (ulong)*(byte *)((long)DTable + uVar10 * 4 + 7);
        uVar11 = (local_68.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
        *(short *)((long)dst + uVar10) = (short)DTable[uVar11 + 1];
        iVar9 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar9;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        lVar3 = uVar11 + uVar10;
        uVar13 = (local_68.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
        *(short *)((long)dst + uVar11 + uVar10) = (short)DTable[uVar13 + 1];
        iVar9 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar9;
        uVar10 = (local_68.bitContainer << ((byte)iVar9 & 0x3f)) >> bVar6;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        *(short *)((long)dst + uVar11 + lVar3) = (short)DTable[uVar10 + 1];
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar10 * 4 + 7) + uVar11 + lVar3)
        ;
      }
    }
    local_68.bitsConsumed = (uint)uVar10;
  }
LAB_0019f57f:
  uVar7 = (uint)uVar10;
  if (1 < (ulong)((long)puVar1 - (long)dst)) {
    while (uVar7 = (uint)uVar10, uVar7 < 0x41) {
      if (local_68.ptr < local_68.limitPtr) {
        if (local_68.ptr == local_68.start) break;
        bVar14 = local_68.start <= (size_t *)((long)local_68.ptr - (uVar10 >> 3));
        uVar11 = (ulong)(uint)((int)local_68.ptr - iVar12);
        if (bVar14) {
          uVar11 = uVar10 >> 3;
        }
        local_68.bitsConsumed = uVar7 + (int)uVar11 * -8;
      }
      else {
        uVar11 = uVar10 >> 3;
        local_68.bitsConsumed = uVar7 & 7;
        bVar14 = true;
      }
      local_68.ptr = (char *)((long)local_68.ptr - uVar11);
      uVar10 = (ulong)local_68.bitsConsumed;
      local_68.bitContainer = *(size_t *)local_68.ptr;
      if ((puVar1 + -1 < dst) || (!bVar14)) break;
      uVar10 = (local_68.bitContainer << ((byte)local_68.bitsConsumed & 0x3f)) >> (-cVar2 & 0x3fU);
      *(short *)dst = (short)DTable[uVar10 + 1];
      local_68.bitsConsumed = *(byte *)((long)DTable + uVar10 * 4 + 6) + local_68.bitsConsumed;
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar10 * 4 + 7));
      uVar10 = (ulong)local_68.bitsConsumed;
    }
    for (; uVar7 = (uint)uVar10, dst <= puVar1 + -1;
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7))) {
      uVar11 = (local_68.bitContainer << ((byte)uVar10 & 0x3f)) >> (-cVar2 & 0x3fU);
      *(short *)dst = (short)DTable[uVar11 + 1];
      local_68.bitsConsumed = *(byte *)((long)DTable + uVar11 * 4 + 6) + local_68.bitsConsumed;
      uVar10 = (ulong)local_68.bitsConsumed;
    }
  }
  if (dst < puVar1) {
    uVar10 = (local_68.bitContainer << ((byte)uVar7 & 0x3f)) >> (-cVar2 & 0x3fU);
    *(char *)dst = (char)DTable[uVar10 + 1];
    if (*(char *)((long)DTable + uVar10 * 4 + 7) == '\x01') {
      uVar7 = *(byte *)((long)DTable + uVar10 * 4 + 6) + local_68.bitsConsumed;
    }
    else {
      uVar7 = local_68.bitsConsumed;
      if (local_68.bitsConsumed < 0x40) {
        local_68.bitsConsumed = local_68.bitsConsumed + *(byte *)((long)DTable + uVar10 * 4 + 6);
        uVar7 = 0x40;
        if (local_68.bitsConsumed < 0x40) {
          uVar7 = local_68.bitsConsumed;
        }
      }
    }
  }
  if (local_68.ptr != local_68.start) {
    dstSize = 0xffffffffffffffec;
  }
  if (uVar7 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)

size_t HUF_decompress1X2_DCtx_wksp(HUF_DTable* DCtx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize, int flags)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX2_wksp(DCtx, cSrc, cSrcSize,
                                               workSpace, wkspSize, flags);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, ip, cSrcSize, DCtx, flags);
}